

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O0

void call_from_thread(int *n_chr,int *m_chr,double *NM_chr,int *NI,double *eta_chr,double *Pj_chr,
                     string *query_path,string *reference_path,string *chrom_size_path,int chr_id,
                     string *id,int scale)

{
  string *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000028;
  double *in_stack_000006b8;
  double *in_stack_000006c0;
  int *in_stack_000006c8;
  double *in_stack_000006d0;
  int *in_stack_000006d8;
  int *in_stack_000006e0;
  string *in_stack_000006f0;
  string *in_stack_000006f8;
  string *in_stack_00000700;
  int in_stack_00000708;
  string *in_stack_00000710;
  int in_stack_00000718;
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [80];
  
  std::__cxx11::string::string(local_50,in_stack_00000008);
  std::__cxx11::string::string(local_70,in_stack_00000010);
  std::__cxx11::string::string(local_a0,in_stack_00000018);
  std::__cxx11::string::string(local_c0,in_stack_00000028);
  chrom(in_stack_000006e0,in_stack_000006d8,in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,
        in_stack_000006b8,in_stack_000006f0,in_stack_000006f8,in_stack_00000700,in_stack_00000708,
        in_stack_00000710,in_stack_00000718);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void call_from_thread(int* n_chr, int* m_chr, double* NM_chr, int* NI, double* eta_chr, double* Pj_chr, 
                      string query_path, string reference_path, string chrom_size_path, int chr_id,
                      string id, int scale)
{
    chrom(n_chr, m_chr, NM_chr, NI, eta_chr, Pj_chr, query_path, reference_path, chrom_size_path,
                      chr_id, id, scale);
}